

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<kj::Own<kj::AsyncCapabilityStream>_> __thiscall
kj::_::
TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>,_kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1823:13),_kj::_::PropagateException>
::anon_class_1_0_00000001_for_func::operator()
          (anon_class_1_0_00000001_for_func *this,Maybe<kj::Own<kj::AsyncCapabilityStream>_> *result
          )

{
  AsyncCapabilityStream *pAVar1;
  char *pcVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  char (*in_RCX) [41];
  long *in_RDX;
  ImmediatePromiseNode<kj::Own<kj::AsyncCapabilityStream>_> *pIVar7;
  ImmediatePromiseNode<kj::Own<kj::AsyncCapabilityStream>_> *extraout_RDX;
  ImmediatePromiseNode<kj::Own<kj::AsyncCapabilityStream>_> *extraout_RDX_00;
  ImmediatePromiseNode<kj::Own<kj::AsyncCapabilityStream>_> *extraout_RDX_01;
  Own<kj::_::ImmediatePromiseNode<kj::Own<kj::AsyncCapabilityStream>_>_> OVar8;
  Promise<kj::Own<kj::AsyncCapabilityStream>_> PVar9;
  Own<kj::AsyncCapabilityStream> local_1a8;
  String local_198;
  undefined8 local_180;
  undefined8 uStack_178;
  Exception local_170;
  
  if (in_RDX[1] == 0) {
    Debug::makeDescription<char_const(&)[41]>
              (&local_198,(Debug *)"\"EOF when expecting to receive capability\"",
               "EOF when expecting to receive capability",in_RCX);
    Exception::Exception
              (&local_170,FAILED,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x724,&local_198);
    heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_180,&local_170);
    uVar4 = uStack_178;
    uStack_178 = 0;
    *(undefined8 *)this = local_180;
    *(undefined8 *)(this + 8) = uVar4;
    Exception::~Exception(&local_170);
    sVar3 = local_198.content.size_;
    pcVar2 = local_198.content.ptr;
    pIVar7 = extraout_RDX_00;
    if (local_198.content.ptr != (char *)0x0) {
      local_198.content.ptr = (char *)0x0;
      local_198.content.size_ = 0;
      (**(local_198.content.disposer)->_vptr_ArrayDisposer)
                (local_198.content.disposer,pcVar2,1,sVar3,sVar3,0);
      pIVar7 = extraout_RDX_01;
    }
  }
  else {
    local_1a8.disposer = (Disposer *)*in_RDX;
    local_1a8.ptr = (AsyncCapabilityStream *)in_RDX[1];
    in_RDX[1] = 0;
    OVar8 = heap<kj::_::ImmediatePromiseNode<kj::Own<kj::AsyncCapabilityStream>>,kj::Own<kj::AsyncCapabilityStream>>
                      ((kj *)&local_170,&local_1a8);
    pAVar1 = local_1a8.ptr;
    pIVar7 = OVar8.ptr;
    uVar5 = (undefined4)local_170.ownFile.content.size_;
    uVar6 = local_170.ownFile.content.size_._4_4_;
    local_170.ownFile.content.size_ = 0;
    *(undefined4 *)this = local_170.ownFile.content.ptr._0_4_;
    *(undefined4 *)(this + 4) = local_170.ownFile.content.ptr._4_4_;
    *(undefined4 *)(this + 8) = uVar5;
    *(undefined4 *)(this + 0xc) = uVar6;
    if (local_1a8.ptr != (AsyncCapabilityStream *)0x0) {
      local_1a8.ptr = (AsyncCapabilityStream *)0x0;
      (**(local_1a8.disposer)->_vptr_Disposer)
                (local_1a8.disposer,
                 (pAVar1->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[-2] +
                 (long)&(pAVar1->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream)
      ;
      pIVar7 = extraout_RDX;
    }
  }
  PVar9.super_PromiseBase.node.ptr = (PromiseNode *)pIVar7;
  PVar9.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Own<kj::AsyncCapabilityStream>_>)PVar9.super_PromiseBase.node;
}

Assistant:

KJ_IF_MAYBE(r, result) {
      return kj::mv(*r);
    }